

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feasibility_highs.hpp
# Opt level: O0

void computeStartingPointHighs
               (Instance *instance,Settings *settings,Statistics *stats,QpModelStatus *modelstatus,
               QpHotstartInformation *result,HighsModelStatus *highs_model_status,
               HighsBasis *highs_basis,HighsSolution *highs_solution,HighsTimer *timer)

{
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  double *pdVar4;
  HighsInfo *pHVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  pointer in_RCX;
  pointer __nbytes;
  pointer in_RDX;
  void *__buf;
  pointer in_RSI;
  size_type sVar9;
  pointer in_RDI;
  double extraout_XMM0_Qa;
  byte *in_stack_00000008;
  byte *in_stack_00000010;
  HighsTimer *in_stack_00000018;
  HighsInt ia;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  HighsBasisStatus status_2;
  HighsInt i_6;
  vector<int,_std::allocator<int>_> debug_col_status_count;
  HighsBasisStatus status_1;
  HighsInt i_5;
  vector<int,_std::allocator<int>_> debug_row_status_count;
  HighsInt num_highs_basis_status;
  vector<BasisStatus,_std::allocator<BasisStatus>_> initial_status;
  vector<int,_std::allocator<int>_> initial_inactive;
  vector<int,_std::allocator<int>_> initial_active;
  HighsInt i_4;
  HighsInt i_3;
  QpVector ra;
  QpVector x0;
  double zero_activity_tolerance;
  HighsInt num_small_ra;
  HighsInt num_small_x0;
  HighsModelStatus phase1stat;
  HighsStatus status;
  HighsInt i_2;
  HighsInt i_1;
  HighsBasis basis;
  HighsInt i;
  HighsLp lp;
  double use_time_limit;
  Highs highs;
  HighsSolution use_solution;
  HighsBasis use_basis;
  double sum_con_residuals;
  double max_con_residual;
  double sum_con_infeasibilities;
  double max_con_infeasibility;
  HighsInt num_con_infeasibilities;
  double sum_var_infeasibilities;
  double max_var_infeasibility;
  HighsInt num_var_infeasibilities;
  double primal_feasibility_tolerance;
  bool debug_report;
  bool have_starting_point;
  HighsSolution *in_stack_ffffffffffffa1d8;
  Highs *in_stack_ffffffffffffa1e0;
  Highs *in_stack_ffffffffffffa1e8;
  HighsInt idx;
  Instance *in_stack_ffffffffffffa1f0;
  HighsBasis *in_stack_ffffffffffffa200;
  HighsInt in_stack_ffffffffffffa20c;
  QpVector *in_stack_ffffffffffffa210;
  double local_5db0;
  HighsLp *in_stack_ffffffffffffa258;
  HighsLp *in_stack_ffffffffffffa260;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffa278;
  undefined4 in_stack_ffffffffffffa280;
  HighsStatus in_stack_ffffffffffffa284;
  string *in_stack_ffffffffffffa288;
  allocator *paVar10;
  string *in_stack_ffffffffffffa290;
  undefined7 in_stack_ffffffffffffa298;
  undefined1 in_stack_ffffffffffffa29f;
  double *in_stack_ffffffffffffa2a0;
  double *in_stack_ffffffffffffa2a8;
  HighsInt *in_stack_ffffffffffffa2b0;
  double dVar11;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa2b8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa2c0;
  double in_stack_ffffffffffffa2c8;
  undefined4 in_stack_ffffffffffffa2d0;
  undefined4 in_stack_ffffffffffffa2d4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffa2e0;
  double *in_stack_ffffffffffffa2e8;
  undefined4 in_stack_ffffffffffffa2f0;
  undefined4 in_stack_ffffffffffffa2f4;
  undefined4 in_stack_ffffffffffffa2f8;
  undefined4 in_stack_ffffffffffffa2fc;
  undefined4 in_stack_ffffffffffffa300;
  undefined4 in_stack_ffffffffffffa304;
  undefined4 in_stack_ffffffffffffa318;
  int iVar12;
  int iVar13;
  undefined4 in_stack_ffffffffffffa31c;
  HighsBasis *in_stack_ffffffffffffa320;
  Highs *in_stack_ffffffffffffa328;
  int local_5cb8;
  vector<int,_std::allocator<int>_> local_5cb0;
  undefined4 local_5c94;
  vector<int,_std::allocator<int>_> local_5c78;
  vector<int,_std::allocator<int>_> local_5c60;
  int local_5c48;
  int local_5c44;
  int local_5c40;
  int local_5c3c;
  vector<int,_std::allocator<int>_> vStack_5c38;
  vector<double,_std::allocator<double>_> vStack_5c20;
  int local_5c08;
  int local_5c04;
  vector<int,_std::allocator<int>_> vStack_5c00;
  vector<double,_std::allocator<double>_> vStack_5be8;
  double local_5bd0;
  int local_5bc8;
  int local_5bc4;
  undefined4 local_5bc0;
  int local_5bbc;
  HighsStatus local_5bb8;
  allocator local_5bb1;
  string local_5bb0 [39];
  allocator local_5b89;
  string local_5b88 [34];
  undefined1 local_5b66;
  undefined1 local_5b65;
  int local_5b64;
  undefined1 local_5b5d;
  int local_5b5c;
  undefined1 local_5b57;
  int local_575c;
  undefined8 local_5758;
  undefined4 local_5750;
  undefined4 local_574c;
  vector<double,_std::allocator<double>_> local_5730;
  vector<double,_std::allocator<double>_> local_5718 [3];
  undefined4 local_56d0;
  HighsLp *in_stack_ffffffffffffa9d8;
  Highs *in_stack_ffffffffffffa9e0;
  allocator local_53b1;
  string local_53b0 [32];
  double local_5390;
  double local_5388;
  double local_5380;
  allocator local_5371;
  string local_5370 [39];
  allocator local_5349;
  string local_5348 [32];
  Highs local_5328;
  vector<double,_std::allocator<double>_> avStack_150 [2];
  vector<double,_std::allocator<double>_> avStack_120 [4];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_c0;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_a8;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  _func_int **local_78;
  int local_6c;
  pointer local_68;
  pointer local_60;
  int local_54;
  pointer local_50;
  undefined1 local_42;
  byte local_41;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_41 = 0;
  local_42 = 0;
  __nbytes = in_RCX;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  if ((*in_stack_00000010 & 1) != 0) {
    local_50 = (pointer)in_RSI[7];
    local_54 = 0;
    local_60 = (pointer)0x0;
    local_68 = (pointer)0x0;
    local_6c = 0;
    local_78 = (_func_int **)0x0;
    local_80 = (undefined1  [8])0x0;
    local_88._0_4_ = 0;
    local_88._4_4_ = 0;
    local_90 = 0;
    __nbytes = (pointer)&stack0xffffffffffffffac;
    in_stack_ffffffffffffa1d8 = (HighsSolution *)&stack0xffffffffffffff94;
    in_stack_ffffffffffffa1e0 = (Highs *)&stack0xffffffffffffff88;
    in_stack_ffffffffffffa1e8 = (Highs *)local_80;
    in_stack_ffffffffffffa1f0 = (Instance *)local_88;
    assessQpPrimalFeasibility
              ((Instance *)CONCAT44(in_stack_ffffffffffffa2d4,in_stack_ffffffffffffa2d0),
               in_stack_ffffffffffffa2c8,in_stack_ffffffffffffa2c0,in_stack_ffffffffffffa2b8,
               in_stack_ffffffffffffa2b0,in_stack_ffffffffffffa2a8,in_stack_ffffffffffffa2a0,
               in_stack_ffffffffffffa2e0._M_current,in_stack_ffffffffffffa2e8,
               (double *)CONCAT44(in_stack_ffffffffffffa2f4,in_stack_ffffffffffffa2f0),
               (double *)CONCAT44(in_stack_ffffffffffffa2fc,in_stack_ffffffffffffa2f8),
               (double *)CONCAT44(in_stack_ffffffffffffa304,in_stack_ffffffffffffa300));
    local_41 = 0;
    if ((local_54 == 0) && (local_41 = 0, local_6c == 0)) {
      local_41 = *in_stack_00000008;
    }
    local_41 = local_41 & 1;
  }
  HighsBasis::HighsBasis(in_stack_ffffffffffffa200);
  HighsSolution::HighsSolution((HighsSolution *)in_stack_ffffffffffffa1e0);
  if ((local_41 & 1) == 0) {
    Highs::Highs((Highs *)CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280));
    paVar10 = &local_5349;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5348,"output_flag",paVar10);
    Highs::setOptionValue
              (in_stack_ffffffffffffa1e8,(string *)in_stack_ffffffffffffa1e0,
               SUB81((ulong)in_stack_ffffffffffffa1d8 >> 0x38,0));
    std::__cxx11::string::~string(local_5348);
    std::allocator<char>::~allocator((allocator<char> *)&local_5349);
    paVar10 = &local_5371;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5370,"presolve",paVar10);
    Highs::setOptionValue
              ((Highs *)CONCAT17(in_stack_ffffffffffffa29f,in_stack_ffffffffffffa298),
               in_stack_ffffffffffffa290,in_stack_ffffffffffffa288);
    std::__cxx11::string::~string(local_5370);
    std::allocator<char>::~allocator((allocator<char> *)&local_5371);
    dVar11 = local_20[0x19];
    HighsTimer::read(in_stack_00000018,0,__buf,(size_t)__nbytes);
    local_5388 = dVar11 - extraout_XMM0_Qa;
    local_5390 = 0.001;
    pdVar4 = std::max<double>(&local_5388,&local_5390);
    local_5380 = *pdVar4;
    paVar10 = &local_53b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_53b0,"time_limit",paVar10);
    Highs::setOptionValue
              (in_stack_ffffffffffffa1e8,(string *)in_stack_ffffffffffffa1e0,
               (double)in_stack_ffffffffffffa1d8);
    std::__cxx11::string::~string(local_53b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_53b1);
    HighsLp::HighsLp(in_stack_ffffffffffffa260);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa278);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa278);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa278);
    local_56d0 = 1;
    local_5758 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa1e0,
               (size_type)in_stack_ffffffffffffa1d8,(value_type_conflict1 *)0x752e28);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa278);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa278);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa278);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa278);
    local_5750 = *(undefined4 *)((long)local_18 + 4);
    local_574c = *(undefined4 *)(local_18 + 1);
    if ((*(byte *)((long)local_20 + 0x5d) & 1) != 0) {
      for (local_575c = 0; local_575c < *(int *)((long)local_18 + 4); local_575c = local_575c + 1) {
        bVar3 = isfreevar(in_stack_ffffffffffffa1f0,
                          (HighsInt)((ulong)in_stack_ffffffffffffa1e8 >> 0x20));
        if (bVar3) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_5730,(long)local_575c);
          *pvVar6 = -100000.0;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_5718,(long)local_575c);
          *pvVar6 = 100000.0;
        }
      }
    }
    HighsLp::HighsLp(in_stack_ffffffffffffa260,in_stack_ffffffffffffa258);
    Highs::passModel(in_stack_ffffffffffffa9e0,in_stack_ffffffffffffa9d8);
    HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffffa1e0);
    if ((*(byte *)((long)local_20 + 0x5c) & 1) != 0) {
      HighsBasis::HighsBasis(in_stack_ffffffffffffa200);
      local_5b57 = 1;
      for (local_5b5c = 0; local_5b5c < *(int *)(local_18 + 1); local_5b5c = local_5b5c + 1) {
        local_5b5d = 4;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                   in_stack_ffffffffffffa1e0,&in_stack_ffffffffffffa1d8->value_valid);
      }
      for (local_5b64 = 0; local_5b64 < *(int *)((long)local_18 + 4); local_5b64 = local_5b64 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x3a),
                            (long)local_5b64);
        if ((*pvVar6 != -INFINITY) || (NAN(*pvVar6))) {
LAB_00753238:
          local_5b66 = 4;
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                     in_stack_ffffffffffffa1e0,&in_stack_ffffffffffffa1d8->value_valid);
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x3d),
                              (long)local_5b64);
          if ((*pvVar6 != INFINITY) || (NAN(*pvVar6))) goto LAB_00753238;
          local_5b65 = 1;
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                     in_stack_ffffffffffffa1e0,&in_stack_ffffffffffffa1d8->value_valid);
        }
      }
      paVar10 = &local_5b89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b88,"",paVar10);
      Highs::setBasis(in_stack_ffffffffffffa328,in_stack_ffffffffffffa320,
                      (string *)CONCAT44(in_stack_ffffffffffffa31c,in_stack_ffffffffffffa318));
      std::__cxx11::string::~string(local_5b88);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b89);
      paVar10 = &local_5bb1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5bb0,"simplex_strategy",paVar10);
      Highs::setOptionValue
                (in_stack_ffffffffffffa1e8,(string *)in_stack_ffffffffffffa1e0,
                 (HighsInt)((ulong)in_stack_ffffffffffffa1d8 >> 0x20));
      std::__cxx11::string::~string(local_5bb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5bb1);
      HighsBasis::~HighsBasis((HighsBasis *)in_stack_ffffffffffffa1e0);
    }
    in_stack_ffffffffffffa284 = Highs::run(in_stack_ffffffffffffa1e8);
    local_5bb8 = in_stack_ffffffffffffa284;
    if (in_stack_ffffffffffffa284 == kError) {
      *(int *)local_30 = 9;
      local_5bbc = 1;
    }
    else {
      in_stack_ffffffffffffa278 =
           (vector<BasisStatus,_std::allocator<BasisStatus>_> *)Highs::getModelStatus(&local_5328);
      local_5bc0 = *(undefined4 *)
                    &(((_Vector_base<double,_std::allocator<double>_> *)
                      &in_stack_ffffffffffffa278->
                       super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>)->_M_impl).
                     super__Vector_impl_data._M_start;
      switch(local_5bc0) {
      case 7:
        *(int *)local_30 = 0;
        break;
      case 8:
        *(int *)local_30 = 4;
        break;
      default:
        *(int *)local_30 = 9;
        break;
      case 0xd:
        *(int *)local_30 = 6;
        break;
      case 0x11:
        *(int *)local_30 = 8;
      }
      pHVar5 = Highs::getInfo(&local_5328);
      *(HighsInt *)local_28 = (pHVar5->super_HighsInfoStruct).simplex_iteration_count;
      if (*(int *)local_30 == 0) {
        Highs::getBasis(&local_5328);
        HighsBasis::operator=
                  ((HighsBasis *)in_stack_ffffffffffffa1e0,(HighsBasis *)in_stack_ffffffffffffa1d8);
        Highs::getSolution(&local_5328);
        HighsSolution::operator=
                  ((HighsSolution *)in_stack_ffffffffffffa1e0,in_stack_ffffffffffffa1d8);
        local_5bbc = 0;
      }
      else {
        local_5bbc = 1;
      }
    }
    HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffffa1e0);
    Highs::~Highs(in_stack_ffffffffffffa1e0);
    if (local_5bbc != 0) goto LAB_00753fa2;
  }
  else {
    HighsBasis::operator=
              ((HighsBasis *)in_stack_ffffffffffffa1e0,(HighsBasis *)in_stack_ffffffffffffa1d8);
    HighsSolution::operator=((HighsSolution *)in_stack_ffffffffffffa1e0,in_stack_ffffffffffffa1d8);
    *(int *)local_30 = 0;
  }
  local_5bc4 = 0;
  local_5bc8 = 0;
  local_5db0 = 0.0;
  if ((local_41 & 1) == 0) {
    local_5db0 = 0.0001;
  }
  local_5bd0 = local_5db0;
  QpVector::QpVector(in_stack_ffffffffffffa210,in_stack_ffffffffffffa20c);
  QpVector::QpVector(in_stack_ffffffffffffa210,in_stack_ffffffffffffa20c);
  for (local_5c44 = 0; local_5c44 < local_5c04; local_5c44 = local_5c44 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](avStack_150,(long)local_5c44);
    if (ABS(*pvVar6) <= local_5bd0) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (avStack_150,(long)local_5c44);
      if (0.0 < ABS(*pvVar6)) {
        local_5bc4 = local_5bc4 + 1;
      }
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (avStack_150,(long)local_5c44);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&vStack_5be8,(long)local_5c44);
      iVar12 = local_5c44;
      *pvVar6 = vVar1;
      sVar9 = (size_type)local_5c08;
      local_5c08 = local_5c08 + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_5c00,sVar9);
      *pvVar7 = iVar12;
    }
  }
  for (local_5c48 = 0; local_5c48 < local_5c3c; local_5c48 = local_5c48 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](avStack_120,(long)local_5c48);
    if (ABS(*pvVar6) <= local_5bd0) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (avStack_120,(long)local_5c48);
      if (0.0 < ABS(*pvVar6)) {
        local_5bc8 = local_5bc8 + 1;
      }
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (avStack_120,(long)local_5c48);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&vStack_5c20,(long)local_5c48);
      iVar12 = local_5c48;
      *pvVar6 = vVar1;
      sVar9 = (size_type)local_5c40;
      local_5c40 = local_5c40 + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_5c38,sVar9);
      *pvVar7 = iVar12;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7538f1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7538fe);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)0x75390b);
  local_5c94 = 5;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x753928);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
             (size_type)in_stack_ffffffffffffa1d8,(value_type_conflict2 *)0x75394a);
  for (local_5cb8 = 0;
      sVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size(&vStack_a8),
      local_5cb8 < (int)sVar9; local_5cb8 = local_5cb8 + 1) {
    pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&vStack_a8,(long)local_5cb8);
    vVar2 = *pvVar8;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_5cb0,(long)(int)(uint)vVar2);
    *pvVar7 = *pvVar7 + 1;
    if (vVar2 == kLower) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1e8);
      std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_ffffffffffffa1e0,
                 (value_type *)in_stack_ffffffffffffa1d8);
    }
    else if (vVar2 == kUpper) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1e8);
      std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_ffffffffffffa1e0,
                 (value_type *)in_stack_ffffffffffffa1d8);
    }
    else if (vVar2 == kZero) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1e8);
    }
    else if (vVar2 != kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1e8);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x753ae1);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
             (size_type)in_stack_ffffffffffffa1d8,(value_type_conflict2 *)0x753b03);
  iVar12 = 0;
  while (iVar13 = iVar12,
        sVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size(&vStack_c0),
        iVar12 < (int)sVar9) {
    pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&vStack_c0,(long)iVar13);
    vVar2 = *pvVar8;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffa320,
                        (long)(int)(uint)vVar2);
    *pvVar7 = *pvVar7 + 1;
    idx = (HighsInt)((ulong)in_stack_ffffffffffffa1e8 >> 0x20);
    if (vVar2 == kLower) {
      bVar3 = isfreevar(in_stack_ffffffffffffa1f0,idx);
      if (bVar3) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                   (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                   (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                  ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_ffffffffffffa1e0,
                   (value_type *)in_stack_ffffffffffffa1d8);
      }
    }
    else if (vVar2 == kUpper) {
      bVar3 = isfreevar(in_stack_ffffffffffffa1f0,idx);
      if (bVar3) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                   (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                   (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::push_back
                  ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_ffffffffffffa1e0,
                   (value_type *)in_stack_ffffffffffffa1d8);
      }
    }
    else if (vVar2 == kZero) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
    }
    else if (vVar2 != kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1e0,
                 (value_type_conflict2 *)in_stack_ffffffffffffa1d8);
    }
    iVar12 = iVar13 + 1;
  }
  sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_5c60);
  iVar12 = (int)sVar9;
  sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_5c78);
  if (iVar12 + (int)sVar9 == *(int *)((long)local_18 + 4)) {
    if ((local_41 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1d8);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1d8);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffa1e0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffa1d8), bVar3) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffa2e0);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffa2e0);
      }
    }
    std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
              ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               in_stack_ffffffffffffa278);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa278);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffa284,in_stack_ffffffffffffa280),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa278);
    QpVector::operator=((QpVector *)in_stack_ffffffffffffa1e0,(QpVector *)in_stack_ffffffffffffa1d8)
    ;
    QpVector::operator=((QpVector *)in_stack_ffffffffffffa1e0,(QpVector *)in_stack_ffffffffffffa1d8)
    ;
    local_5bbc = 0;
  }
  else {
    *(int *)local_30 = 9;
    local_5bbc = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::~vector
            ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)in_stack_ffffffffffffa1f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa1f0);
  QpVector::~QpVector((QpVector *)in_stack_ffffffffffffa1e0);
  QpVector::~QpVector((QpVector *)in_stack_ffffffffffffa1e0);
LAB_00753fa2:
  HighsSolution::~HighsSolution((HighsSolution *)in_stack_ffffffffffffa1e0);
  HighsBasis::~HighsBasis((HighsBasis *)in_stack_ffffffffffffa1e0);
  return;
}

Assistant:

static void computeStartingPointHighs(
    Instance& instance, Settings& settings, Statistics& stats,
    QpModelStatus& modelstatus, QpHotstartInformation& result,
    HighsModelStatus& highs_model_status, HighsBasis& highs_basis,
    HighsSolution& highs_solution, HighsTimer& timer) {
  bool have_starting_point = false;
  const bool debug_report = false;
  if (highs_solution.value_valid) {
    // #1350 add primal_feasibility_tolerance to settings
    const double primal_feasibility_tolerance = settings.lambda_zero_threshold;

    HighsInt num_var_infeasibilities = 0;
    double max_var_infeasibility = 0;
    double sum_var_infeasibilities = 0;
    HighsInt num_con_infeasibilities = 0;
    double max_con_infeasibility = 0;
    double sum_con_infeasibilities = 0;
    double max_con_residual = 0;
    double sum_con_residuals = 0;

    assessQpPrimalFeasibility(
        instance, primal_feasibility_tolerance, highs_solution.col_value,
        highs_solution.row_value, num_var_infeasibilities,
        max_var_infeasibility, sum_var_infeasibilities, num_con_infeasibilities,
        max_con_infeasibility, sum_con_infeasibilities, max_con_residual,
        sum_con_residuals);

    if (debug_report)
      printf(
          "computeStartingPointHighs highs_solution has (num / max / sum) "
          "var (%d / %g / %g) and "
          "con (%d / %g / %g) infeasibilities "
          "with (max = %g; sum = %g) residuals\n",
          int(num_var_infeasibilities), max_var_infeasibility,
          sum_var_infeasibilities, int(num_con_infeasibilities),
          max_con_infeasibility, sum_con_infeasibilities, max_con_residual,
          sum_con_residuals);
    have_starting_point = num_var_infeasibilities == 0 &&
                          num_con_infeasibilities == 0 && highs_basis.valid;
  }
  // compute initial feasible point
  HighsBasis use_basis;
  HighsSolution use_solution;
  if (have_starting_point) {
    use_basis = highs_basis;
    use_solution = highs_solution;
    // Have to assume that the supplied basis is feasible
    modelstatus = QpModelStatus::kNotset;
  } else {
    Highs highs;

    // set HiGHS to be silent
    highs.setOptionValue("output_flag", false);
    highs.setOptionValue("presolve", kHighsOnString);
    // Set the residual time limit
    const double use_time_limit =
        std::max(settings.time_limit - timer.read(), 0.001);
    highs.setOptionValue("time_limit", use_time_limit);

    HighsLp lp;
    lp.a_matrix_.index_ = instance.A.mat.index;
    lp.a_matrix_.start_ = instance.A.mat.start;
    lp.a_matrix_.value_ = instance.A.mat.value;
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.col_cost_.assign(instance.num_var, 0.0);
    // lp.col_cost_ = runtime.instance.c.value;
    lp.col_lower_ = instance.var_lo;
    lp.col_upper_ = instance.var_up;
    lp.row_lower_ = instance.con_lo;
    lp.row_upper_ = instance.con_up;
    lp.num_col_ = instance.num_var;
    lp.num_row_ = instance.num_con;

    // create artificial bounds for free variables: false by default
    assert(!settings.phase1boundfreevars);
    if (settings.phase1boundfreevars) {
      for (HighsInt i = 0; i < instance.num_var; i++) {
        if (isfreevar(instance, i)) {
          lp.col_lower_[i] = -1E5;
          lp.col_upper_[i] = 1E5;
        }
      }
    }

    highs.passModel(lp);
    // Make free variables basic: false by default
    assert(!settings.phase1movefreevarsbasic);
    if (settings.phase1movefreevarsbasic) {
      HighsBasis basis;
      basis.alien = true;  // Set true when basis is instantiated
      for (HighsInt i = 0; i < instance.num_con; i++) {
        basis.row_status.push_back(HighsBasisStatus::kNonbasic);
      }

      for (HighsInt i = 0; i < instance.num_var; i++) {
        // make free variables basic
        if (instance.var_lo[i] == -kHighsInf &&
            instance.var_up[i] == kHighsInf) {
          // free variable
          basis.col_status.push_back(HighsBasisStatus::kBasic);
        } else {
          basis.col_status.push_back(HighsBasisStatus::kNonbasic);
        }
      }

      highs.setBasis(basis);

      highs.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
    }

    HighsStatus status = highs.run();
    if (status == HighsStatus::kError) {
      modelstatus = QpModelStatus::kError;
      return;
    }

    HighsModelStatus phase1stat = highs.getModelStatus();
    switch (phase1stat) {
      case HighsModelStatus::kOptimal:
        modelstatus = QpModelStatus::kNotset;
        break;
      case HighsModelStatus::kInfeasible:
        modelstatus = QpModelStatus::kInfeasible;
        break;
      case HighsModelStatus::kTimeLimit:
        modelstatus = QpModelStatus::kTimeLimit;
        break;
      case HighsModelStatus::kInterrupt:
        modelstatus = QpModelStatus::kInterrupt;
        break;
      default:
        modelstatus = QpModelStatus::kError;
    }

    stats.phase1_iterations = highs.getInfo().simplex_iteration_count;

    if (modelstatus != QpModelStatus::kNotset) return;

    // Should only get here if feasibility problem is solved to
    // optimality - hence there is a feasible basis
    assert(phase1stat == HighsModelStatus::kOptimal);

    use_basis = highs.getBasis();
    use_solution = highs.getSolution();
  }

  HighsInt num_small_x0 = 0;
  HighsInt num_small_ra = 0;
  const double zero_activity_tolerance = have_starting_point ? 0 : 1e-4;
  QpVector x0(instance.num_var);
  QpVector ra(instance.num_con);
  for (HighsInt i = 0; i < x0.dim; i++) {
    if (fabs(use_solution.col_value[i]) > zero_activity_tolerance) {
      x0.value[i] = use_solution.col_value[i];
      x0.index[x0.num_nz++] = i;
    } else if (fabs(use_solution.col_value[i]) > 0) {
      num_small_x0++;
    }
  }

  for (HighsInt i = 0; i < ra.dim; i++) {
    if (fabs(use_solution.row_value[i]) > zero_activity_tolerance) {
      ra.value[i] = use_solution.row_value[i];
      ra.index[ra.num_nz++] = i;
    } else if (fabs(use_solution.row_value[i]) > 0) {
      num_small_ra++;
    }
  }
  if (debug_report && num_small_x0 + num_small_ra)
    printf(
        "feasibility_highs has %d small col values and %d small row values\n",
        int(num_small_x0), int(num_small_ra));
  std::vector<HighsInt> initial_active;
  std::vector<HighsInt> initial_inactive;
  std::vector<BasisStatus> initial_status;

  const HighsInt num_highs_basis_status =
      HighsInt(HighsBasisStatus::kNonbasic) + 1;
  std::vector<HighsInt> debug_row_status_count;
  debug_row_status_count.assign(num_highs_basis_status, 0);
  for (HighsInt i = 0; i < HighsInt(use_basis.row_status.size()); i++) {
    HighsBasisStatus status = use_basis.row_status[i];
    debug_row_status_count[HighsInt(status)]++;
    if (status == HighsBasisStatus::kLower) {
      initial_active.push_back(i);
      initial_status.push_back(BasisStatus::kActiveAtLower);
    } else if (status == HighsBasisStatus::kUpper) {
      initial_active.push_back(i);
      initial_status.push_back(BasisStatus::kActiveAtUpper);
    } else if (status == HighsBasisStatus::kZero) {
      // Shouldn't happen, since free rows are basic in a logical
      // basis and remain basic, or are removed by presolve and
      // restored as basic in postsolve
      assert(111 == 222);
      // That said, a free row that is nonbasic in the Highs basis
      // must be counted as inactive in the QP basis for accounting
      // purposes
      initial_inactive.push_back(i);
    } else if (status != HighsBasisStatus::kBasic) {
      assert(status == HighsBasisStatus::kNonbasic);
      // Surely an error, but not a problem before, since simplex
      // solver cannot return a HighsBasisStatus::kNonbasic
      // variable. Does matter now, since a saved QP basis will
      // generally have such variables.
      //
      //      initial_inactive.push_back(instance.num_con + i);
      //
      // A HighsBasisStatus::kNonbasic variable corresponds one-to-one
      // with being inactive in the QP basis
      initial_inactive.push_back(i);
    } else {
      assert(status == HighsBasisStatus::kBasic);
    }
  }

  std::vector<HighsInt> debug_col_status_count;
  debug_col_status_count.assign(num_highs_basis_status, 0);
  for (HighsInt i = 0; i < HighsInt(use_basis.col_status.size()); i++) {
    HighsBasisStatus status = use_basis.col_status[i];
    debug_col_status_count[HighsInt(status)]++;
    if (status == HighsBasisStatus::kLower) {
      if (isfreevar(instance, i)) {
        initial_inactive.push_back(instance.num_con + i);
      } else {
        initial_active.push_back(instance.num_con + i);
        initial_status.push_back(BasisStatus::kActiveAtLower);
      }

    } else if (status == HighsBasisStatus::kUpper) {
      if (isfreevar(instance, i)) {
        initial_inactive.push_back(instance.num_con + i);
      } else {
        initial_active.push_back(instance.num_con + i);
        initial_status.push_back(BasisStatus::kActiveAtUpper);
      }

    } else if (status == HighsBasisStatus::kZero) {
      initial_inactive.push_back(instance.num_con + i);
    } else if (status != HighsBasisStatus::kBasic) {
      assert(status == HighsBasisStatus::kNonbasic);
      initial_inactive.push_back(instance.num_con + i);
    } else {
      assert(status == HighsBasisStatus::kBasic);
    }
  }

  if (debug_report) {
    printf("QP solver initial basis: (Lo / Bs / Up / Ze / Nb) for cols (");
    for (HighsInt k = 0; k < num_highs_basis_status; k++)
      printf("%s%d", k == 0 ? "" : " / ", int(debug_col_status_count[k]));
    printf(") and rows (");
    for (HighsInt k = 0; k < num_highs_basis_status; k++)
      printf("%s%d", k == 0 ? "" : " / ", int(debug_row_status_count[k]));
    printf(")\n");
  }

  // This used to be an assert
  if ((HighsInt)(initial_active.size() + initial_inactive.size()) !=
      instance.num_var) {
    modelstatus = QpModelStatus::kError;
    return;
  }

  if (!have_starting_point) {
    // When starting from a feasible basis, there will generally be
    // inactive variables in the basis that aren't free
    for (HighsInt ia : initial_inactive) {
      if (ia < instance.num_con) {
        // printf("free row %d\n", (int)ia);
        assert(instance.con_lo[ia] == -kHighsInf);
        assert(instance.con_up[ia] == kHighsInf);
      } else {
        // printf("free col %d\n", (int)ia);
        assert(instance.var_lo[ia - instance.num_con] == -kHighsInf);
        assert(instance.var_up[ia - instance.num_con] == kHighsInf);
      }
    }
  }

  result.status = initial_status;
  result.active = initial_active;
  result.inactive = initial_inactive;
  result.primal = x0;
  result.rowact = ra;
}